

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

Lit __thiscall Gluco::Solver::pickBranchLit(Solver *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  bool local_49;
  lbool local_20;
  lbool local_1f;
  lbool local_1e;
  lbool local_1d;
  int local_1c;
  Solver *pSStack_18;
  Var next;
  Solver *this_local;
  
  local_1c = -1;
  pSStack_18 = this;
  dVar5 = drand(&this->random_seed);
  if ((dVar5 < this->random_var_freq) &&
     (bVar1 = Heap<Gluco::Solver::VarOrderLt>::empty(&this->order_heap), !bVar1)) {
    iVar3 = Heap<Gluco::Solver::VarOrderLt>::size(&this->order_heap);
    iVar3 = irand(&this->random_seed,iVar3);
    local_1c = Heap<Gluco::Solver::VarOrderLt>::operator[](&this->order_heap,iVar3);
    local_1d = value(this,local_1c);
    lbool::lbool(&local_1e,'\x02');
    bVar2 = lbool::operator==(&local_1d,local_1e);
    bVar1 = false;
    if (bVar2) {
      pcVar4 = vec<char>::operator[](&this->decision,local_1c);
      bVar1 = *pcVar4 != '\0';
    }
    if (bVar1) {
      this->rnd_decisions = this->rnd_decisions + 1;
    }
  }
  while( true ) {
    bVar1 = true;
    if (local_1c != -1) {
      local_1f = value(this,local_1c);
      lbool::lbool(&local_20,'\x02');
      bVar2 = lbool::operator!=(&local_1f,local_20);
      bVar1 = true;
      if (!bVar2) {
        pcVar4 = vec<char>::operator[](&this->decision,local_1c);
        bVar1 = *pcVar4 == '\0';
      }
    }
    if (!bVar1) goto LAB_00726b61;
    bVar1 = Heap<Gluco::Solver::VarOrderLt>::empty(&this->order_heap);
    if (bVar1) break;
    local_1c = Heap<Gluco::Solver::VarOrderLt>::removeMin(&this->order_heap);
  }
  local_1c = -1;
LAB_00726b61:
  iVar3 = local_1c;
  if (local_1c == -1) {
    this_local._4_4_ = -2;
  }
  else {
    if ((this->rnd_pol & 1U) == 0) {
      pcVar4 = vec<char>::operator[](&this->polarity,local_1c);
      local_49 = *pcVar4 != '\0';
    }
    else {
      dVar5 = drand(&this->random_seed);
      local_49 = dVar5 < 0.5;
    }
    this_local._4_4_ = mkLit(iVar3,local_49);
  }
  return (Lit)this_local._4_4_;
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();
    
    return next == var_Undef ? lit_Undef : mkLit(next, rnd_pol ? drand(random_seed) < 0.5 : (polarity[next] != 0));
}